

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

bool __thiscall
Js::DynamicObjectPropertyEnumerator::CanUseJITFastPath(DynamicObjectPropertyEnumerator *this)

{
  CachedData *pCVar1;
  
  pCVar1 = (this->cachedData).ptr;
  if ((pCVar1 != (CachedData *)0x0) &&
     (((this->scriptContext).ptr)->threadContext->TTDLog != (EventLog *)0x0)) {
    TTDAbort_unrecoverable_error
              ("We should always have cachedData null if we are in record or replay mode");
  }
  if ((this->object).ptr != (DynamicObject *)0x0) {
    return pCVar1 != (CachedData *)0x0 && (this->flags & EnumNonEnumerable) == None;
  }
  return false;
}

Assistant:

bool DynamicObjectPropertyEnumerator::CanUseJITFastPath() const
    {
#if ENABLE_TTD
        TTDAssert(this->cachedData == nullptr || !this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode(), "We should always have cachedData null if we are in record or replay mode");
#endif

        return !this->IsNullEnumerator() && !GetEnumNonEnumerable() && this->cachedData != nullptr;
    }